

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcUnroll.c
# Opt level: O3

void Unr_ManFree(Unr_Man_t *p)

{
  Vec_Int_t *pVVar1;
  
  Gia_ManStop(p->pFrames);
  pVVar1 = p->vOrder;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      p->vOrder->pArray = (int *)0x0;
      pVVar1 = p->vOrder;
      if (pVVar1 == (Vec_Int_t *)0x0) goto LAB_005bf7cb;
    }
    free(pVVar1);
    p->vOrder = (Vec_Int_t *)0x0;
  }
LAB_005bf7cb:
  pVVar1 = p->vOrderLim;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      p->vOrderLim->pArray = (int *)0x0;
      pVVar1 = p->vOrderLim;
      if (pVVar1 == (Vec_Int_t *)0x0) goto LAB_005bf807;
    }
    free(pVVar1);
    p->vOrderLim = (Vec_Int_t *)0x0;
  }
LAB_005bf807:
  pVVar1 = p->vTents;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      p->vTents->pArray = (int *)0x0;
      pVVar1 = p->vTents;
      if (pVVar1 == (Vec_Int_t *)0x0) goto LAB_005bf843;
    }
    free(pVVar1);
    p->vTents = (Vec_Int_t *)0x0;
  }
LAB_005bf843:
  pVVar1 = p->vRanks;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      p->vRanks->pArray = (int *)0x0;
      pVVar1 = p->vRanks;
      if (pVVar1 == (Vec_Int_t *)0x0) goto LAB_005bf87f;
    }
    free(pVVar1);
    p->vRanks = (Vec_Int_t *)0x0;
  }
LAB_005bf87f:
  pVVar1 = p->vObjLim;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      p->vObjLim->pArray = (int *)0x0;
      pVVar1 = p->vObjLim;
      if (pVVar1 == (Vec_Int_t *)0x0) goto LAB_005bf8bb;
    }
    free(pVVar1);
    p->vObjLim = (Vec_Int_t *)0x0;
  }
LAB_005bf8bb:
  pVVar1 = p->vCiMap;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      p->vCiMap->pArray = (int *)0x0;
      pVVar1 = p->vCiMap;
      if (pVVar1 == (Vec_Int_t *)0x0) goto LAB_005bf8f7;
    }
    free(pVVar1);
    p->vCiMap = (Vec_Int_t *)0x0;
  }
LAB_005bf8f7:
  pVVar1 = p->vCoMap;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      p->vCoMap->pArray = (int *)0x0;
      pVVar1 = p->vCoMap;
      if (pVVar1 == (Vec_Int_t *)0x0) goto LAB_005bf933;
    }
    free(pVVar1);
    p->vCoMap = (Vec_Int_t *)0x0;
  }
LAB_005bf933:
  pVVar1 = p->vPiLits;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      p->vPiLits->pArray = (int *)0x0;
      pVVar1 = p->vPiLits;
      if (pVVar1 == (Vec_Int_t *)0x0) goto LAB_005bf96f;
    }
    free(pVVar1);
    p->vPiLits = (Vec_Int_t *)0x0;
  }
LAB_005bf96f:
  if (p->pObjs != (int *)0x0) {
    free(p->pObjs);
  }
  free(p);
  return;
}

Assistant:

void Unr_ManFree( Unr_Man_t * p )
{
    Gia_ManStop( p->pFrames );
    // intermediate data
    Vec_IntFreeP( &p->vOrder );
    Vec_IntFreeP( &p->vOrderLim );
    Vec_IntFreeP( &p->vTents );
    Vec_IntFreeP( &p->vRanks );
    // unrolling data
    Vec_IntFreeP( &p->vObjLim );
    Vec_IntFreeP( &p->vCiMap );
    Vec_IntFreeP( &p->vCoMap );
    Vec_IntFreeP( &p->vPiLits );
    ABC_FREE( p->pObjs );
    ABC_FREE( p );
}